

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::ByteSizeLong
          (DictionaryValue_KeyValuePair *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->key_ == (Value *)0x0 ||
      this == (DictionaryValue_KeyValuePair *)&_DictionaryValue_KeyValuePair_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::Value>(this->key_);
    sVar1 = sVar1 + 1;
  }
  if (this->value_ != (Value *)0x0 &&
      this != (DictionaryValue_KeyValuePair *)&_DictionaryValue_KeyValuePair_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::Value>(this->value_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t DictionaryValue_KeyValuePair::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  size_t total_size = 0;

  // .CoreML.Specification.MILSpec.Value key = 1;
  if (this->has_key()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->key_);
  }

  // .CoreML.Specification.MILSpec.Value value = 2;
  if (this->has_value()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->value_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}